

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O1

bool all_tensors_in_other(gguf_context *ctx,gguf_context *other)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *__s;
  long lVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  string name;
  allocator<char> local_61;
  gguf_context *local_60;
  ulong local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_60 = other;
  uVar1 = gguf_get_n_tensors();
  if ((int)uVar1 < 1) {
    bVar7 = true;
  }
  else {
    local_58 = (ulong)(uVar1 & 0x7fffffff);
    uVar8 = 0;
    bVar6 = true;
    do {
      __s = (char *)gguf_get_tensor_name(ctx,uVar8);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_61);
      uVar1 = gguf_find_tensor(local_60,local_50[0]);
      if (uVar8 == uVar1) {
LAB_001088c8:
        iVar2 = gguf_get_tensor_type(ctx,uVar8);
        iVar3 = gguf_get_tensor_type(local_60,uVar8);
        lVar4 = gguf_get_tensor_offset(ctx,uVar8);
        lVar5 = gguf_get_tensor_offset(local_60,uVar8);
        if (iVar2 != iVar3) {
          bVar6 = false;
        }
        bVar7 = bVar6;
        if (lVar4 != lVar5) {
          bVar7 = false;
        }
      }
      else {
        bVar6 = false;
        bVar7 = false;
        if (-1 < (int)uVar1) goto LAB_001088c8;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      uVar8 = uVar8 + 1;
      bVar6 = bVar7;
    } while (local_58 != uVar8);
  }
  return bVar7;
}

Assistant:

static bool all_tensors_in_other(const gguf_context * ctx, const gguf_context * other) {
    bool ok = true;

    const int n_tensors = gguf_get_n_tensors(ctx);
    for (int id = 0; id < n_tensors; ++id) {
        const std::string name = gguf_get_tensor_name(ctx, id);

        const int idx_other = gguf_find_tensor(other, name.c_str());
        if (id != idx_other) {
            ok = false;
            if (idx_other < 0) {
                continue;
            }
        }

        const ggml_type type = gguf_get_tensor_type(ctx, id);
        if (type != gguf_get_tensor_type(other, id)) {
            ok = false;
        }

        const size_t offset = gguf_get_tensor_offset(ctx, id);
        if (offset != gguf_get_tensor_offset(other, id)) {
            ok = false;
        }
    }

    return ok;
}